

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O0

void Assimp::IFC::ProcessConnectedFaceSet
               (IfcConnectedFaceSet *fset,TempMesh *result,ConversionData *conv)

{
  bool bVar1;
  undefined1 *this;
  Lazy *pLVar2;
  vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
  *this_00;
  IfcLoop *pIVar3;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  format local_220;
  IfcPolyLoop *local_a8;
  IfcPolyLoop *polyloop;
  IfcFaceBound *local_90;
  IfcFaceBound *bound;
  const_iterator __end3;
  const_iterator __begin3;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_1UL,_0UL> *__range3;
  TempMesh meshout;
  IfcFace *face;
  const_iterator __end2;
  const_iterator __begin2;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_1UL,_0UL> *__range2;
  ConversionData *conv_local;
  TempMesh *result_local;
  IfcConnectedFaceSet *fset_local;
  
  this = &(fset->super_IfcTopologicalRepresentationItem).field_0x30;
  __end2 = std::
           vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_>_>
           ::begin((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_>_>
                    *)this);
  face = (IfcFace *)
         std::
         vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_>_>
         ::end((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_>_>
                *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_>_>_>
                                     *)&face), bVar1) {
    pLVar2 = (Lazy *)__gnu_cxx::
                     __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_>_>_>
                     ::operator*(&__end2);
    meshout.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)STEP::Lazy::operator_cast_to_IfcFace_(pLVar2);
    TempMesh::TempMesh((TempMesh *)&__range3);
    this_00 = (vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
               *)(meshout.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage + 0xc);
    __end3 = std::
             vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
             ::begin(this_00);
    bound = (IfcFaceBound *)
            std::
            vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
            ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>_>
                                       *)&bound), bVar1) {
      pLVar2 = (Lazy *)__gnu_cxx::
                       __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>_>
                       ::operator*(&__end3);
      local_90 = STEP::Lazy::operator_cast_to_IfcFaceBound_(pLVar2);
      pIVar3 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcLoop>::operator->
                         ((Lazy<Assimp::IFC::Schema_2x3::IfcLoop> *)
                          &(local_90->super_IfcTopologicalRepresentationItem).field_0x30);
      local_a8 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcPolyLoop>
                           ((Object *)
                            ((long)&(pIVar3->super_IfcTopologicalRepresentationItem).
                                    super_IfcRepresentationItem.
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                    ._vptr_ObjectHelper +
                            (long)(pIVar3->super_IfcTopologicalRepresentationItem).
                                  super_IfcRepresentationItem.
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                  ._vptr_ObjectHelper[-3]));
      if (local_a8 == (IfcPolyLoop *)0x0) {
        pIVar3 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcLoop>::operator->
                           ((Lazy<Assimp::IFC::Schema_2x3::IfcLoop> *)
                            &(local_90->super_IfcTopologicalRepresentationItem).field_0x30);
        STEP::Object::GetClassName_abi_cxx11_
                  (&local_260,
                   (Object *)
                   ((long)&(pIVar3->super_IfcTopologicalRepresentationItem).
                           super_IfcRepresentationItem.
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           _vptr_ObjectHelper +
                   (long)(pIVar3->super_IfcTopologicalRepresentationItem).
                         super_IfcRepresentationItem.
                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                         _vptr_ObjectHelper[-3]));
        std::operator+(&local_240,"skipping unknown IfcFaceBound entity, type is ",&local_260);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_220,
                   &local_240);
        LogFunctions<Assimp::IFCImporter>::LogWarn(&local_220);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_220);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
      }
      else {
        ProcessPolyloop(local_a8,(TempMesh *)&__range3,conv);
      }
      __gnu_cxx::
      __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>_>
      ::operator++(&__end3);
    }
    ProcessPolygonBoundaries(result,(TempMesh *)&__range3,0xffffffffffffffff);
    TempMesh::~TempMesh((TempMesh *)&__range3);
    __gnu_cxx::
    __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void ProcessConnectedFaceSet(const Schema_2x3::IfcConnectedFaceSet& fset, TempMesh& result, ConversionData& conv)
{
    for(const Schema_2x3::IfcFace& face : fset.CfsFaces) {
        // size_t ob = -1, cnt = 0;
        TempMesh meshout;
        for(const Schema_2x3::IfcFaceBound& bound : face.Bounds) {

            if(const Schema_2x3::IfcPolyLoop* const polyloop = bound.Bound->ToPtr<Schema_2x3::IfcPolyLoop>()) {
                if(ProcessPolyloop(*polyloop, meshout,conv)) {

                    // The outer boundary is better determined by checking which
                    // polygon covers the largest area.

                    //if(bound.ToPtr<IfcFaceOuterBound>()) {
                    //  ob = cnt;
                    //}
                    //++cnt;

                }
            }
            else {
                IFCImporter::LogWarn("skipping unknown IfcFaceBound entity, type is " + bound.Bound->GetClassName());
                continue;
            }

            // And this, even though it is sometimes TRUE and sometimes FALSE,
            // does not really improve results.

            /*if(!IsTrue(bound.Orientation)) {
                size_t c = 0;
                for(unsigned int& c : meshout.vertcnt) {
                    std::reverse(result.verts.begin() + cnt,result.verts.begin() + cnt + c);
                    cnt += c;
                }
            }*/
        }
        ProcessPolygonBoundaries(result, meshout);
    }
}